

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineInterface.hpp
# Opt level: O0

void __thiscall supermap::cli::CommandLineInterface::Handler::~Handler(Handler *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR___cxa_pure_virtual_0016ea50;
  std::__cxx11::string::~string((string *)(in_RDI + 1));
  return;
}

Assistant:

virtual ~Handler() = default;